

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

void pollJoystickEvents(void)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  char local_4058 [8];
  char path [20];
  inotify_event *e_1;
  regmatch_t match;
  ssize_t size;
  char buffer [16384];
  long local_20;
  ssize_t offset;
  short local_10;
  byte local_e;
  byte local_d;
  js_event e;
  int i;
  
  local_20 = 0;
  match = (regmatch_t)read(_glfw.linux_js.inotify,&size,0x4000);
  for (; local_20 < (long)match;
      local_20 = (ulong)*(uint *)(stack0xffffffffffffbfc0 + 0xc) + 0x10 + local_20) {
    register0x00000000 = buffer + local_20 + -8;
    iVar1 = regexec((regex_t *)&_glfw.linux_js.regex,buffer + local_20 + 8,1,(regmatch_t *)&e_1,0);
    if (iVar1 == 0) {
      snprintf(local_4058,0x14,"/dev/input/%s",stack0xffffffffffffbfc0 + 0x10);
      openJoystickDevice(local_4058);
    }
  }
  for (e.time = 0; (int)e.time < 0x10; e.time = e.time + 1) {
    if (_glfw.linux_js.js[(int)e.time].present != 0) {
      while( true ) {
        piVar2 = __errno_location();
        *piVar2 = 0;
        sVar3 = read(_glfw.linux_js.js[(int)e.time].fd,(void *)((long)&offset + 4),8);
        if (sVar3 < 0) break;
        local_e = local_e & 0x7f;
        if (local_e == 1) {
          _glfw.linux_js.js[(int)e.time].buttons[local_d] = local_10 != 0;
        }
        else if (local_e == 2) {
          _glfw.linux_js.js[(int)e.time].axes[local_d] = (float)(int)local_10 / 32767.0;
        }
      }
      piVar2 = __errno_location();
      if (*piVar2 == 0x13) {
        free(_glfw.linux_js.js[(int)e.time].axes);
        free(_glfw.linux_js.js[(int)e.time].buttons);
        free(_glfw.linux_js.js[(int)e.time].name);
        free(_glfw.linux_js.js[(int)e.time].path);
        memset(_glfw.linux_js.js + (int)e.time,0,0x38);
      }
    }
  }
  return;
}

Assistant:

static void pollJoystickEvents(void)
{
#if defined(__linux__)
    int i;
    struct js_event e;
    ssize_t offset = 0;
    char buffer[16384];

    const ssize_t size = read(_glfw.linux_js.inotify, buffer, sizeof(buffer));

    while (size > offset)
    {
        regmatch_t match;
        const struct inotify_event* e = (struct inotify_event*) (buffer + offset);

        if (regexec(&_glfw.linux_js.regex, e->name, 1, &match, 0) == 0)
        {
            char path[20];
            snprintf(path, sizeof(path), "/dev/input/%s", e->name);
            openJoystickDevice(path);
        }

        offset += sizeof(struct inotify_event) + e->len;
    }

    for (i = 0;  i <= GLFW_JOYSTICK_LAST;  i++)
    {
        if (!_glfw.linux_js.js[i].present)
            continue;

        // Read all queued events (non-blocking)
        for (;;)
        {
            errno = 0;
            if (read(_glfw.linux_js.js[i].fd, &e, sizeof(e)) < 0)
            {
                if (errno == ENODEV)
                {
                    // The joystick was disconnected

                    free(_glfw.linux_js.js[i].axes);
                    free(_glfw.linux_js.js[i].buttons);
                    free(_glfw.linux_js.js[i].name);
                    free(_glfw.linux_js.js[i].path);

                    memset(&_glfw.linux_js.js[i], 0, sizeof(_glfw.linux_js.js[i]));
                }

                break;
            }

            // We don't care if it's an init event or not
            e.type &= ~JS_EVENT_INIT;

            switch (e.type)
            {
                case JS_EVENT_AXIS:
                    _glfw.linux_js.js[i].axes[e.number] =
                        (float) e.value / 32767.0f;
                    break;

                case JS_EVENT_BUTTON:
                    _glfw.linux_js.js[i].buttons[e.number] =
                        e.value ? GLFW_PRESS : GLFW_RELEASE;
                    break;

                default:
                    break;
            }
        }
    }
#endif // __linux__
}